

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O1

void saturate_threadpool(void)

{
  int iVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  code *pcVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  undefined1 *extraout_RDX_01;
  uv_work_t *puVar8;
  uint uVar9;
  int iVar10;
  uv_work_t *puVar11;
  long lVar12;
  long lVar13;
  uv_sem_t *puVar14;
  char buf [64];
  undefined1 auStack_1f98 [152];
  undefined1 auStack_1f00 [2056];
  undefined1 *puStack_16f8;
  code *pcStack_16f0;
  undefined1 *puStack_16e8;
  uv_sem_t *puStack_16e0;
  code *pcStack_16d8;
  undefined1 auStack_16c8 [144];
  undefined1 auStack_1638 [8];
  undefined1 *puStack_1630;
  undefined1 *puStack_1628;
  code *pcStack_1620;
  code *pcStack_1618;
  undefined1 auStack_1608 [16];
  undefined1 *puStack_15f8;
  undefined8 uStack_15f0;
  undefined1 auStack_15e8 [152];
  undefined1 auStack_1550 [1320];
  undefined1 auStack_1028 [1320];
  undefined1 auStack_b00 [1320];
  undefined1 auStack_5d8 [1328];
  undefined1 *puStack_a8;
  code *pcStack_a0;
  uv_work_t *puStack_98;
  undefined1 *puStack_90;
  code *pcStack_88;
  code *pcStack_80;
  char acStack_78 [72];
  
  lVar12 = 0;
  pcVar7 = (code *)0x4;
  pcStack_80 = (code *)0x175af1;
  snprintf(acStack_78,0x40,"UV_THREADPOOL_SIZE=%lu");
  pcStack_80 = (code *)0x175af9;
  putenv(acStack_78);
  puVar8 = pause_reqs;
  pcStack_80 = (code *)0x175b05;
  puVar2 = (undefined1 *)uv_default_loop();
  while( true ) {
    puVar3 = (undefined1 *)((long)pause_sems + lVar12);
    iVar10 = 0;
    pcStack_80 = (code *)0x175b2d;
    iVar1 = uv_sem_init();
    if (iVar1 != 0) break;
    pcVar7 = done_cb;
    pcStack_80 = (code *)0x175b42;
    puVar11 = puVar8;
    puVar3 = puVar2;
    iVar1 = uv_queue_work(puVar2,puVar8,work_cb);
    iVar10 = (int)puVar11;
    if (iVar1 != 0) {
      pcStack_80 = (code *)0x175b66;
      saturate_threadpool_cold_2();
      break;
    }
    lVar12 = lVar12 + 0x20;
    puVar8 = puVar8 + 1;
    if (lVar12 == 0x80) {
      return;
    }
  }
  pcStack_80 = getaddrinfo_cb;
  saturate_threadpool_cold_1();
  if (iVar10 == -0xbbb) {
    if (extraout_RDX == 0) {
      uv_freeaddrinfo(0);
      return;
    }
  }
  else {
    pcStack_88 = (code *)0x175b86;
    getaddrinfo_cb_cold_1();
  }
  pcStack_88 = timer_cb;
  getaddrinfo_cb_cold_2();
  pcStack_88 = (code *)0x80;
  puStack_98 = puVar8;
  puStack_90 = puVar2;
  if (*(int *)(puVar3 + -8) == 0) {
LAB_00175bb4:
    lVar12 = 0;
    pcStack_a0 = (code *)0x175bc1;
    uv_close(puVar3,0);
    do {
      pcStack_a0 = (code *)0x175bd1;
      uv_sem_post((long)pause_sems + lVar12);
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x80);
    timer_cb_called = timer_cb_called + 1;
    return;
  }
  uVar9 = 0;
  while( true ) {
    pcStack_a0 = (code *)0x175ba9;
    iVar1 = uv_cancel((ulong)(*(int *)(puVar3 + -4) * uVar9) + *(long *)(puVar3 + -0x10));
    if (iVar1 != 0) break;
    uVar9 = uVar9 + 1;
    if (*(uint *)(puVar3 + -8) <= uVar9) goto LAB_00175bb4;
  }
  pcStack_a0 = run_test_threadpool_cancel_getnameinfo;
  timer_cb_cold_1();
  iVar10 = 0x50;
  pcStack_1618 = (code *)0x175c0e;
  puStack_a8 = puVar3;
  pcStack_a0 = (code *)puVar2;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,auStack_1608);
  if (iVar1 == 0) {
    puVar2 = auStack_1550;
    uStack_15f0 = 0x52800000004;
    pcStack_1618 = (code *)0x175c37;
    puStack_15f8 = puVar2;
    puVar3 = (undefined1 *)uv_default_loop();
    pcStack_1618 = (code *)0x175c3f;
    saturate_threadpool();
    pcVar7 = (code *)auStack_1608;
    pcStack_1618 = (code *)0x175c59;
    puVar6 = puVar2;
    iVar1 = uv_getnameinfo(puVar3,puVar2,getnameinfo_cb,pcVar7,0);
    iVar10 = (int)puVar6;
    if (iVar1 != 0) goto LAB_00175d65;
    puVar6 = auStack_1028;
    pcVar7 = (code *)auStack_1608;
    pcStack_1618 = (code *)0x175c80;
    iVar1 = uv_getnameinfo(puVar3,puVar6,getnameinfo_cb,pcVar7,0);
    iVar10 = (int)puVar6;
    if (iVar1 != 0) goto LAB_00175d6a;
    puVar6 = auStack_b00;
    pcVar7 = (code *)auStack_1608;
    pcStack_1618 = (code *)0x175ca7;
    iVar1 = uv_getnameinfo(puVar3,puVar6,getnameinfo_cb,pcVar7,0);
    iVar10 = (int)puVar6;
    if (iVar1 != 0) goto LAB_00175d6f;
    puVar6 = auStack_5d8;
    pcVar7 = (code *)auStack_1608;
    pcStack_1618 = (code *)0x175cce;
    iVar1 = uv_getnameinfo(puVar3,puVar6,getnameinfo_cb,pcVar7,0);
    iVar10 = (int)puVar6;
    if (iVar1 != 0) goto LAB_00175d74;
    puVar2 = auStack_15e8;
    pcStack_1618 = (code *)0x175ce6;
    puVar6 = puVar2;
    iVar1 = uv_timer_init(puVar3);
    iVar10 = (int)puVar6;
    if (iVar1 != 0) goto LAB_00175d79;
    iVar10 = 0x175b8b;
    pcVar7 = (code *)0x0;
    pcStack_1618 = (code *)0x175d04;
    iVar1 = uv_timer_start(puVar2,timer_cb,10);
    if (iVar1 != 0) goto LAB_00175d7e;
    iVar10 = 0;
    pcStack_1618 = (code *)0x175d12;
    iVar1 = uv_run(puVar3);
    if (iVar1 != 0) goto LAB_00175d83;
    if (timer_cb_called != 1) goto LAB_00175d88;
    pcStack_1618 = (code *)0x175d24;
    puVar3 = (undefined1 *)uv_default_loop();
    pcStack_1618 = (code *)0x175d38;
    uv_walk(puVar3,close_walk_cb,0);
    iVar10 = 0;
    pcStack_1618 = (code *)0x175d42;
    uv_run(puVar3);
    pcStack_1618 = (code *)0x175d47;
    uVar4 = uv_default_loop();
    pcStack_1618 = (code *)0x175d4f;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_1618 = (code *)0x175d65;
    run_test_threadpool_cancel_getnameinfo_cold_1();
LAB_00175d65:
    pcStack_1618 = (code *)0x175d6a;
    run_test_threadpool_cancel_getnameinfo_cold_2();
LAB_00175d6a:
    pcStack_1618 = (code *)0x175d6f;
    run_test_threadpool_cancel_getnameinfo_cold_3();
LAB_00175d6f:
    pcStack_1618 = (code *)0x175d74;
    run_test_threadpool_cancel_getnameinfo_cold_4();
LAB_00175d74:
    pcStack_1618 = (code *)0x175d79;
    run_test_threadpool_cancel_getnameinfo_cold_5();
LAB_00175d79:
    pcStack_1618 = (code *)0x175d7e;
    run_test_threadpool_cancel_getnameinfo_cold_6();
LAB_00175d7e:
    pcStack_1618 = (code *)0x175d83;
    run_test_threadpool_cancel_getnameinfo_cold_7();
LAB_00175d83:
    pcStack_1618 = (code *)0x175d88;
    run_test_threadpool_cancel_getnameinfo_cold_8();
LAB_00175d88:
    pcStack_1618 = (code *)0x175d8d;
    run_test_threadpool_cancel_getnameinfo_cold_9();
  }
  pcStack_1618 = getnameinfo_cb;
  run_test_threadpool_cancel_getnameinfo_cold_10();
  if (iVar10 == -0xbbb) {
    if (extraout_RDX_00 != 0) goto LAB_00175dac;
    if (pcVar7 == (code *)0x0) {
      return;
    }
  }
  else {
    pcStack_1620 = (code *)0x175dac;
    getnameinfo_cb_cold_1();
LAB_00175dac:
    pcStack_1620 = (code *)0x175db1;
    getnameinfo_cb_cold_2();
  }
  pcStack_1620 = run_test_threadpool_cancel_random;
  getnameinfo_cb_cold_3();
  pcStack_1620 = work_cb;
  pcStack_16d8 = (code *)0x175dc7;
  puStack_1630 = puVar3;
  puStack_1628 = puVar2;
  saturate_threadpool();
  pcStack_16d8 = (code *)0x175dcc;
  puVar5 = (undefined1 *)uv_default_loop();
  puVar3 = auStack_16c8;
  lVar12 = 1;
  pcStack_16d8 = (code *)0x175df3;
  puVar6 = puVar5;
  iVar1 = uv_random(puVar5,puVar3,auStack_1638,1,0,nop_random_cb);
  iVar10 = (int)puVar3;
  if (iVar1 == 0) {
    puVar6 = auStack_16c8;
    pcStack_16d8 = (code *)0x175e05;
    iVar1 = uv_cancel();
    if (iVar1 != 0) goto LAB_00175e99;
    if (done_cb_called == 0) {
      lVar13 = 0;
      puVar14 = pause_sems;
      do {
        pcStack_16d8 = (code *)0x175e2d;
        uv_sem_post((long)pause_sems + lVar13);
        lVar13 = lVar13 + 0x20;
      } while (lVar13 != 0x80);
      iVar10 = 0;
      pcStack_16d8 = (code *)0x175e44;
      puVar6 = puVar5;
      iVar1 = uv_run();
      puVar2 = (undefined1 *)0x80;
      if (iVar1 == 0) {
        if (done_cb_called != 1) goto LAB_00175ea8;
        pcStack_16d8 = (code *)0x175e56;
        puVar5 = (undefined1 *)uv_default_loop();
        pcStack_16d8 = (code *)0x175e6a;
        uv_walk(puVar5,close_walk_cb,0);
        iVar10 = 0;
        pcStack_16d8 = (code *)0x175e74;
        uv_run(puVar5);
        pcStack_16d8 = (code *)0x175e79;
        puVar6 = (undefined1 *)uv_default_loop();
        pcStack_16d8 = (code *)0x175e81;
        iVar1 = uv_loop_close();
        if (iVar1 == 0) {
          return;
        }
      }
      else {
LAB_00175ea3:
        pcStack_16d8 = (code *)0x175ea8;
        run_test_threadpool_cancel_random_cold_4();
LAB_00175ea8:
        pcStack_16d8 = (code *)0x175ead;
        run_test_threadpool_cancel_random_cold_5();
      }
      pcStack_16d8 = nop_random_cb;
      run_test_threadpool_cancel_random_cold_6();
      if (iVar10 == -0x7d) {
        if (puVar6 + 0x90 != extraout_RDX_01) goto LAB_00175ed7;
        if (lVar12 == 1) {
          done_cb_called = done_cb_called + 1;
          return;
        }
      }
      else {
        puStack_16e0 = (uv_sem_t *)0x175ed7;
        nop_random_cb_cold_1();
LAB_00175ed7:
        puStack_16e0 = (uv_sem_t *)0x175edc;
        nop_random_cb_cold_2();
      }
      puStack_16e0 = (uv_sem_t *)run_test_threadpool_cancel_work;
      nop_random_cb_cold_3();
      pcStack_16f0 = done_cb;
      puStack_16f8 = puVar5;
      puStack_16e8 = puVar2;
      puStack_16e0 = puVar14;
      uVar4 = uv_default_loop();
      saturate_threadpool();
      lVar12 = 0;
      do {
        iVar1 = uv_queue_work(uVar4,auStack_1f00 + lVar12,work2_cb,done2_cb);
        if (iVar1 != 0) {
          run_test_threadpool_cancel_work_cold_1();
LAB_00175ff3:
          run_test_threadpool_cancel_work_cold_2();
LAB_00175ff8:
          run_test_threadpool_cancel_work_cold_3();
LAB_00175ffd:
          run_test_threadpool_cancel_work_cold_4();
LAB_00176002:
          run_test_threadpool_cancel_work_cold_5();
          goto LAB_00176007;
        }
        lVar12 = lVar12 + 0x80;
      } while (lVar12 != 0x800);
      iVar1 = uv_timer_init(uVar4,auStack_1f98);
      if (iVar1 != 0) goto LAB_00175ff3;
      iVar1 = uv_timer_start(auStack_1f98,timer_cb,10,0);
      if (iVar1 != 0) goto LAB_00175ff8;
      iVar1 = uv_run(uVar4,0);
      if (iVar1 != 0) goto LAB_00175ffd;
      if (timer_cb_called != 1) goto LAB_00176002;
      if (done2_cb_called == 0x10) {
        uVar4 = uv_default_loop();
        uv_walk(uVar4,close_walk_cb,0);
        uv_run(uVar4,0);
        uVar4 = uv_default_loop();
        iVar1 = uv_loop_close(uVar4);
        if (iVar1 == 0) {
          return;
        }
        goto LAB_0017600c;
      }
LAB_00176007:
      run_test_threadpool_cancel_work_cold_6();
LAB_0017600c:
      run_test_threadpool_cancel_work_cold_7();
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
              ,0x75,"0 && \"work2_cb called\"");
      abort();
    }
  }
  else {
    pcStack_16d8 = (code *)0x175e99;
    run_test_threadpool_cancel_random_cold_1();
LAB_00175e99:
    pcStack_16d8 = (code *)0x175e9e;
    run_test_threadpool_cancel_random_cold_2();
  }
  pcStack_16d8 = (code *)0x175ea3;
  run_test_threadpool_cancel_random_cold_3();
  puVar14 = (uv_sem_t *)work_cb;
  goto LAB_00175ea3;
}

Assistant:

static void saturate_threadpool(void) {
  uv_loop_t* loop;
  char buf[64];
  size_t i;

  snprintf(buf,
           sizeof(buf),
           "UV_THREADPOOL_SIZE=%lu",
           (unsigned long)ARRAY_SIZE(pause_reqs));
  putenv(buf);

  loop = uv_default_loop();
  for (i = 0; i < ARRAY_SIZE(pause_reqs); i += 1) {
    ASSERT(0 == uv_sem_init(pause_sems + i, 0));
    ASSERT(0 == uv_queue_work(loop, pause_reqs + i, work_cb, done_cb));
  }
}